

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O3

int ggwave_ndecode(ggwave_Instance id,void *waveformBuffer,int waveformSize,void *payloadBuffer,
                  int payloadSize)

{
  uint uVar1;
  GGWave *this;
  uchar *__src;
  bool bVar2;
  long lVar3;
  uint uVar4;
  
  this = (GGWave *)(&(anonymous_namespace)::g_instances)[id];
  bVar2 = GGWave::decode(this,waveformBuffer,waveformSize);
  if (bVar2) {
    lVar3 = __tls_get_addr(&PTR_0010ffb8);
    if (*(char *)(lVar3 + 0x28) == '\0') {
      *(undefined1 *)(lVar3 + 0x28) = 1;
    }
    uVar1 = (this->m_rx).dataLength;
    if ((ulong)uVar1 == 0) {
      uVar4 = payloadSize >> 0x1f & 0xfffffffe;
    }
    else {
      (this->m_rx).dataLength = 0;
      if (uVar1 == 0xffffffff) {
        uVar4 = 0xffffffff;
      }
      else {
        __src = (this->m_rx).data.m_data;
        *(uchar **)(lVar3 + 0x18) = __src;
        *(uint *)(lVar3 + 0x20) = uVar1;
        uVar4 = 0xfffffffe;
        if (((int)uVar1 <= payloadSize) && (uVar4 = uVar1, 0 < (int)uVar1)) {
          memcpy(payloadBuffer,__src,(ulong)uVar1);
        }
      }
    }
  }
  else {
    uVar4 = 0xffffffff;
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Failed to decode data - GGWave instance %d\n",
              (ulong)(uint)id);
    }
  }
  return uVar4;
}

Assistant:

int ggwave_ndecode(
        ggwave_Instance id,
        const void * waveformBuffer,
        int waveformSize,
        void * payloadBuffer,
        int payloadSize) {
    GGWave * ggWave = (GGWave *) g_instances[id];

    if (ggWave->decode(waveformBuffer, waveformSize) == false) {
        ggprintf("Failed to decode data - GGWave instance %d\n", id);
        return -1;
    }

    static thread_local GGWave::TxRxData data;

    const auto dataLength = ggWave->rxTakeData(data);
    if (dataLength == -1) {
        // failed to decode message
        return -1;
    } else if (dataLength > payloadSize) {
        // the payloadBuffer is not big enough to store the data
        return -2;
    } else if (dataLength > 0) {
        memcpy(payloadBuffer, data.data(), dataLength);
    }

    return dataLength;
}